

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor_function.hpp
# Opt level: O3

void asio::detail::executor_function::
     complete<asio::detail::binder1<helics::BrokerBase::queueProcessingLoop()::__0,std::error_code>,std::allocator<void>>
               (impl_base *base,bool call)

{
  undefined3 in_register_00000031;
  allocator<void> allocator;
  ptr p;
  binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_std::error_code>
  function;
  allocator<void> local_41;
  ptr local_40;
  undefined1 local_28 [24];
  error_category *peStack_10;
  
  local_40.a = &local_41;
  local_28._0_8_ = base[1].complete_;
  local_28._8_8_ = base[2].complete_;
  local_28._16_8_ = base[3].complete_;
  peStack_10 = (error_category *)base[4].complete_;
  local_40.v = base;
  local_40.p = (impl<asio::detail::binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_std::error_code>,_std::allocator<void>_>
                *)base;
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_40);
  if (CONCAT31(in_register_00000031,call) != 0) {
    binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_std::error_code>
    ::operator()((binder1<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_GMLC_TDC[P]HELICS_src_helics_core_BrokerBase_cpp:884:26),_std::error_code>
                  *)local_28);
  }
  impl<asio::detail::binder1<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/core/BrokerBase.cpp:884:26),_std::error_code>,_std::allocator<void>_>
  ::ptr::reset(&local_40);
  return;
}

Assistant:

static void complete(impl_base* base, bool call)
  {
    // Take ownership of the function object.
    impl<Function, Alloc>* i(static_cast<impl<Function, Alloc>*>(base));
    Alloc allocator(i->allocator_);
    typename impl<Function, Alloc>::ptr p = {
      detail::addressof(allocator), i, i };

    // Make a copy of the function so that the memory can be deallocated before
    // the upcall is made. Even if we're not about to make an upcall, a
    // sub-object of the function may be the true owner of the memory
    // associated with the function. Consequently, a local copy of the function
    // is required to ensure that any owning sub-object remains valid until
    // after we have deallocated the memory here.
    Function function(static_cast<Function&&>(i->function_));
    p.reset();

    // Make the upcall if required.
    if (call)
    {
      static_cast<Function&&>(function)();
    }
  }